

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O0

void __thiscall depspawn::internal::arg_info::solve_overlap(arg_info *this,arg_info *other)

{
  arg_info **ppaVar1;
  bool bVar2;
  arg_info *in_RSI;
  long *in_RDI;
  bool orwr;
  size_t tmp_size;
  byte local_1a;
  
  local_1a = 1;
  if ((*(byte *)(in_RDI + 4) & 1) == 0) {
    local_1a = in_RSI->wr;
  }
  bVar2 = (bool)(local_1a & 1);
  if (in_RDI[1] == in_RSI->size) {
    in_RSI->wr = bVar2;
    LinkedListPool<depspawn::internal::arg_info,_true,_false>::free
              ((LinkedListPool<depspawn::internal::arg_info,_true,_false> *)Pool,in_RDI);
  }
  else if ((ulong)in_RDI[1] < in_RSI->size) {
    if (bVar2 == (bool)(in_RSI->wr & 1U)) {
      LinkedListPool<depspawn::internal::arg_info,_true,_false>::free
                ((LinkedListPool<depspawn::internal::arg_info,_true,_false> *)Pool,in_RDI);
    }
    else {
      ppaVar1 = (arg_info **)in_RDI[1];
      *in_RDI = in_RDI[1] + *in_RDI;
      in_RDI[1] = in_RSI->size - in_RDI[1];
      *(byte *)(in_RDI + 4) = in_RSI->wr & 1;
      in_RSI->size = (size_t)ppaVar1;
      in_RSI->wr = bVar2;
      insert_in_arglist(in_RSI,ppaVar1);
    }
  }
  else if (bVar2 == (bool)(*(byte *)(in_RDI + 4) & 1)) {
    in_RSI->wr = bVar2;
    in_RSI->size = in_RDI[1];
    LinkedListPool<depspawn::internal::arg_info,_true,_false>::free
              ((LinkedListPool<depspawn::internal::arg_info,_true,_false> *)Pool,in_RDI);
  }
  else {
    ppaVar1 = (arg_info **)in_RSI->size;
    *in_RDI = (long)ppaVar1 + *in_RDI;
    in_RDI[1] = in_RDI[1] - (long)ppaVar1;
    insert_in_arglist(in_RSI,ppaVar1);
  }
  return;
}

Assistant:

void arg_info::solve_overlap(arg_info *other)
    { size_t tmp_size;
      
      //fprintf(stderr, "%zu [%d %zu] [d %zu]\n", addr, other->wr, other->size, wr, size);
      
      const bool orwr = wr || other->wr;
      
      if(size == other->size) {
	other->wr = orwr;
	Pool.free(this);
      } else if (size < other->size) {
	
	if(orwr == other->wr)
	  Pool.free(this);
	else {
	  tmp_size = size;
	  
	  addr += size;
	  size = other->size - size;
	  wr = other->wr; //should be false
	  
	  other->size = tmp_size;
	  other->wr = orwr; //should be true
	  
	  insert_in_arglist(other);
	}
	
      } else { //size > other->size
	
	if(orwr == wr) {
	  other->wr = orwr;
	  other->size = size;
	  Pool.free(this);
	} else { //Should be other->wr = true, this->wr = false
	  tmp_size = other->size;
	  
	  addr += tmp_size;
	  size -= tmp_size;
	  
	  insert_in_arglist(other);
	}
	
      }
      
    }